

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int modRMRequired(OpcodeType type,InstructionContext insnContext,uint16_t opcode)

{
  uint8_t index;
  uint8_t *indextable;
  OpcodeDecision *decision;
  uint16_t opcode_local;
  InstructionContext insnContext_local;
  OpcodeType type_local;
  uint local_4;
  
  switch(type) {
  default:
    decision = x86DisassemblerOneByteOpcodes;
    indextable = "\x01\x02\x03\x04";
    break;
  case TWOBYTE:
    decision = x86DisassemblerTwoByteOpcodes;
    indextable = "\x01\x02\x03\x04";
    break;
  case THREEBYTE_38:
    decision = x86DisassemblerThreeByte38Opcodes;
    indextable = "\x01\x02\x03\x04";
    break;
  case THREEBYTE_3A:
    decision = x86DisassemblerThreeByte3AOpcodes;
    indextable = "\x01\x02\x03\x04";
    break;
  case XOP8_MAP:
    decision = x86DisassemblerXOP8Opcodes;
    indextable = "";
    break;
  case XOP9_MAP:
    decision = x86DisassemblerXOP9Opcodes;
    indextable = "";
    break;
  case XOPA_MAP:
    decision = x86DisassemblerXOPAOpcodes;
    indextable = "";
    break;
  case T3DNOW_MAP:
    return 1;
  }
  if (indextable[insnContext] == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (uint)(decision[(int)(indextable[insnContext] - 1)].modRMDecisions[opcode].modrm_type
                    != '\0');
  }
  return local_4;
}

Assistant:

static int modRMRequired(OpcodeType type,
		InstructionContext insnContext,
		uint16_t opcode)
{
	const struct OpcodeDecision *decision = NULL;
	const uint8_t *indextable = NULL;
	uint8_t index;

	switch (type) {
		default:
		case ONEBYTE:
			decision = ONEBYTE_SYM;
			indextable = index_x86DisassemblerOneByteOpcodes;
			break;
		case TWOBYTE:
			decision = TWOBYTE_SYM;
			indextable = index_x86DisassemblerTwoByteOpcodes;
			break;
		case THREEBYTE_38:
			decision = THREEBYTE38_SYM;
			indextable = index_x86DisassemblerThreeByte38Opcodes;
			break;
		case THREEBYTE_3A:
			decision = THREEBYTE3A_SYM;
			indextable = index_x86DisassemblerThreeByte3AOpcodes;
			break;
#ifndef CAPSTONE_X86_REDUCE
		case XOP8_MAP:
			decision = XOP8_MAP_SYM;
			indextable = index_x86DisassemblerXOP8Opcodes;
			break;
		case XOP9_MAP:
			decision = XOP9_MAP_SYM;
			indextable = index_x86DisassemblerXOP9Opcodes;
			break;
		case XOPA_MAP:
			decision = XOPA_MAP_SYM;
			indextable = index_x86DisassemblerXOPAOpcodes;
			break;
		case T3DNOW_MAP:
			// 3DNow instructions always have ModRM byte
			return true;
#endif
	}

	index = indextable[insnContext];
	if (index)
		return decision[index - 1].modRMDecisions[opcode].modrm_type != MODRM_ONEENTRY;
	else
		return false;
}